

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integercompressor.cpp
# Opt level: O0

void __thiscall IntegerCompressor::compress(IntegerCompressor *this,I32 pred,I32 real,U32 context)

{
  I32 local_20;
  I32 corr;
  U32 context_local;
  I32 real_local;
  I32 pred_local;
  IntegerCompressor *this_local;
  
  if (this->enc == (ArithmeticEncoder *)0x0) {
    __assert_fail("enc",
                  "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/integercompressor.cpp"
                  ,0x10a,"void IntegerCompressor::compress(I32, I32, U32)");
  }
  local_20 = real - pred;
  if (local_20 < this->corr_min) {
    local_20 = this->corr_range + local_20;
  }
  else if (this->corr_max < local_20) {
    local_20 = local_20 - this->corr_range;
  }
  writeCorrector(this,local_20,this->mBits[context]);
  return;
}

Assistant:

void IntegerCompressor::compress(I32 pred, I32 real, U32 context)
{
  assert(enc);
  // the corrector will be within the interval [ - (corr_range - 1)  ...  + (corr_range - 1) ]
  I32 corr = real - pred;
  // we fold the corrector into the interval [ corr_min  ...  corr_max ]
  if (corr < corr_min) corr += corr_range;
  else if (corr > corr_max) corr -= corr_range;
  writeCorrector(corr, mBits[context]);
}